

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

void cfd::core::TaprootUtil::ParseTaprootSignData
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *witness_stack,
               SchnorrSignature *schnorr_signature,bool *has_parity,uint8_t *tapleaf_bit,
               SchnorrPubkey *internal_pubkey,
               vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes,
               Script *tapscript,
               vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *stack,
               ByteData *annex)

{
  pointer pBVar1;
  pointer puVar2;
  ByteData *data_00;
  bool bVar3;
  uint8_t uVar4;
  byte bVar5;
  size_t sVar6;
  CfdException *pCVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  size_t max_node;
  Deserializer parser;
  ByteData data;
  Script script;
  ByteData256 pubkey_bytes;
  SchnorrPubkey local_118;
  ulong local_f8;
  Deserializer local_f0;
  vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *local_c8;
  ByteData local_c0;
  byte *local_a8;
  ulong local_a0;
  Script local_98;
  ByteData256 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  pBVar1 = (witness_stack->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = ((long)pBVar1 -
            (long)(witness_stack->
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_c8 = (vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)nodes;
  local_a8 = tapleaf_bit;
  if (((1 < uVar10) && (bVar3 = ByteData::IsEmpty(pBVar1 + -1), !bVar3)) &&
     (uVar4 = ByteData::GetHeadData
                        ((witness_stack->
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         )._M_impl.super__Vector_impl_data._M_finish + -1), uVar4 == 'P')) {
    if (annex != (ByteData *)0x0) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&annex->data_,
                 &(witness_stack->
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                  _M_impl.super__Vector_impl_data._M_finish[-1].data_);
    }
    uVar10 = uVar10 - 1;
  }
  if (uVar10 == 1) {
    if (schnorr_signature != (SchnorrSignature *)0x0) {
      data_00 = (witness_stack->
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((witness_stack->
          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
          super__Vector_impl_data._M_finish == data_00) {
        uVar8 = 0;
        local_a0 = 0;
        goto LAB_0046ebfc;
      }
      SchnorrSignature::SchnorrSignature((SchnorrSignature *)&local_98,data_00);
      SchnorrSignature::operator=(schnorr_signature,(SchnorrSignature *)&local_98);
      if (local_98._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_98._vptr_Script);
      }
    }
  }
  else {
    if (uVar10 == 0) {
      local_98._vptr_Script = (_func_int **)0x59d98f;
      local_98.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x280;
      local_98.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "ParseTaprootSignData";
      logger::log<>((CfdSourceLocation *)&local_98,kCfdLogLevelWarning,"witness_stack is empty.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_98._vptr_Script =
           (_func_int **)
           ((long)&local_98.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"witness_stack is empty.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_98);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_a0 = uVar10 - 2;
    pBVar1 = (witness_stack->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = ((long)(witness_stack->
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) *
            -0x5555555555555555;
    if (uVar8 < local_a0 || uVar8 - local_a0 == 0) {
LAB_0046ebfc:
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                 local_a0,uVar8);
    }
    Script::Script(&local_98,pBVar1 + local_a0);
    uVar8 = uVar10 - 1;
    pBVar1 = (witness_stack->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = ((long)(witness_stack->
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) *
            -0x5555555555555555;
    if (uVar9 < uVar8 || uVar9 - uVar8 == 0) {
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_c0.data_,&pBVar1[uVar8].data_);
    sVar6 = ByteData::GetDataSize(&local_c0);
    if ((sVar6 < 0x21) || (sVar6 = ByteData::GetDataSize(&local_c0), ((int)sVar6 - 1U & 0x1f) != 0))
    {
      local_f0._vptr_Deserializer = (_func_int **)0x59d98f;
      local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x28c;
      local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "ParseTaprootSignData";
      logger::log<>((CfdSourceLocation *)&local_f0,kCfdLogLevelWarning,"wrong taproot control size."
                   );
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_f0._vptr_Deserializer =
           (_func_int **)
           &local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"wrong taproot control size.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_f0);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar6 = ByteData::GetDataSize(&local_c0);
    local_f8 = sVar6 - 0x21 >> 5;
    if (0x101f < sVar6 - 0x21) {
      local_f0._vptr_Deserializer = (_func_int **)0x59d98f;
      local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x294;
      local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "ParseTaprootSignData";
      logger::log<unsigned_long&>
                ((CfdSourceLocation *)&local_f0,kCfdLogLevelWarning,
                 "taproot control node maximum over. [{}]",&local_f8);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_f0._vptr_Deserializer =
           (_func_int **)
           &local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"taproot control node maximum over.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_f0);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Deserializer::Deserializer(&local_f0,&local_c0);
    bVar5 = Deserializer::ReadUint8(&local_f0);
    if (has_parity != (bool *)0x0) {
      *has_parity = (bool)(bVar5 & 1);
    }
    if (local_a8 != (byte *)0x0) {
      *local_a8 = bVar5 & 0xfe;
    }
    Deserializer::ReadBuffer
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,&local_f0,0x20);
    ByteData256::ByteData256
              (&local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
    if (local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (internal_pubkey != (SchnorrPubkey *)0x0) {
      SchnorrPubkey::SchnorrPubkey(&local_118,&local_60);
      puVar2 = (internal_pubkey->data_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (internal_pubkey->data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (internal_pubkey->data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (internal_pubkey->data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      if (local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if ((local_c8 != (vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)0x0)
       && (local_f8 != 0)) {
      uVar8 = 0;
      do {
        Deserializer::ReadBuffer(&local_48,&local_f0,0x20);
        ByteData256::ByteData256(&local_118.data_,&local_48);
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
        emplace_back<cfd::core::ByteData256&>(local_c8,&local_118.data_);
        if (local_118.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_f8);
    }
    if (tapscript != (Script *)0x0) {
      Script::operator=(tapscript,&local_98);
    }
    if ((stack != (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0) &&
       (2 < uVar10)) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        pBVar1 = (witness_stack->
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = ((long)(witness_stack->
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) *
                -0x5555555555555555;
        if (uVar8 < uVar10 || uVar8 - uVar10 == 0) {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
        }
        ::std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
        emplace_back<cfd::core::ByteData_const&>
                  ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)stack,
                   (ByteData *)
                   ((long)&(pBVar1->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar11));
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x18;
      } while (local_a0 != uVar10);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_f0._vptr_Deserializer = (_func_int **)&PTR__Deserializer_0068f908;
    if ((void *)CONCAT44(local_f0.buffer_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_f0.buffer_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_f0.buffer_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_f0.buffer_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Script::~Script(&local_98);
  }
  return;
}

Assistant:

void TaprootUtil::ParseTaprootSignData(
    const std::vector<ByteData>& witness_stack,
    SchnorrSignature* schnorr_signature, bool* has_parity,
    uint8_t* tapleaf_bit, SchnorrPubkey* internal_pubkey,
    std::vector<ByteData256>* nodes, Script* tapscript,
    std::vector<ByteData>* stack, ByteData* annex) {
  static constexpr size_t kControlMinimumSize =
      SchnorrPubkey::kSchnorrPubkeySize + 1;

  size_t size = witness_stack.size();
  if ((size >= 2) && (!witness_stack.back().IsEmpty()) &&
      (witness_stack.back().GetHeadData() == TaprootUtil::kAnnexTag)) {
    if (annex != nullptr) *annex = witness_stack.back();
    --size;
  }

  if (size == 0) {
    warn(CFD_LOG_SOURCE, "witness_stack is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "witness_stack is empty.");
  } else if (size == 1) {
    if (schnorr_signature != nullptr) {
      *schnorr_signature = SchnorrSignature(witness_stack.at(0));
    }
  } else {
    Script script(witness_stack.at(size - 2));
    ByteData data = witness_stack.at(size - 1);
    if ((data.GetDataSize() < kControlMinimumSize) ||
        (((data.GetDataSize() - 1) % kByteData256Length) != 0)) {
      warn(CFD_LOG_SOURCE, "wrong taproot control size.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "wrong taproot control size.");
    }
    size_t max_node =
        (data.GetDataSize() - kControlMinimumSize) / kByteData256Length;
    if (max_node > TaprootScriptTree::kTaprootControlMaxNodeCount) {
      warn(
          CFD_LOG_SOURCE, "taproot control node maximum over. [{}]", max_node);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "taproot control node maximum over.");
    }

    Deserializer parser(data);
    uint8_t top = parser.ReadUint8();
    if (has_parity != nullptr) *has_parity = (top & 0x01);
    if (tapleaf_bit != nullptr) *tapleaf_bit = top & 0xfe;

    ByteData256 pubkey_bytes(parser.ReadBuffer(kByteData256Length));
    if (internal_pubkey != nullptr) {
      *internal_pubkey = SchnorrPubkey(pubkey_bytes);
    }
    if (nodes != nullptr) {
      for (size_t index = 0; index < max_node; ++index) {
        ByteData256 node(parser.ReadBuffer(kByteData256Length));
        nodes->emplace_back(node);
      }
    }

    if (tapscript != nullptr) *tapscript = script;
    if ((stack != nullptr) && (size > 2)) {
      for (size_t index = 0; index < size - 2; ++index) {
        stack->emplace_back(witness_stack.at(index));
      }
    }
  }
}